

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::deinitSOs
          (GeometryShaderInvalidArrayedInputVariablesTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_id = 0;
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_gs_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vs_id = 0;
  }
  return;
}

Assistant:

void GeometryShaderInvalidArrayedInputVariablesTest::deinitSOs()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);

		m_gs_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}
}